

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_QByteArray>_>::freeData
          (Span<QHashPrivate::Node<int,_QByteArray>_> *this)

{
  byte bVar1;
  Entry *pEVar2;
  int *piVar3;
  long lVar4;
  
  if (this->entries != (Entry *)0x0) {
    lVar4 = 0;
    do {
      bVar1 = this->offsets[lVar4];
      if (bVar1 != 0xff) {
        pEVar2 = this->entries;
        piVar3 = *(int **)(pEVar2[bVar1].storage.data + 8);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)(pEVar2[bVar1].storage.data + 8),1,0x10);
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }